

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.cxx
# Opt level: O3

void __thiscall
cmExportFileGenerator::GenerateTargetFileSets
          (cmExportFileGenerator *this,cmGeneratorTarget *gte,ostream *os,cmTargetExport *te)

{
  pointer pcVar1;
  char *pcVar2;
  cmMakefile *this_00;
  size_type sVar3;
  ostream *poVar4;
  cmFileSet *pcVar5;
  string *psVar6;
  WrapQuotes wrapQuotes;
  cmTargetExport *in_R8;
  pointer name;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  string_view str;
  string_view str_00;
  string targetName;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  interfaceFileSets;
  string local_128;
  cmTargetExport *local_108;
  long *local_100;
  long local_f8;
  long local_f0 [2];
  long *local_e0;
  long local_d8;
  long local_d0 [2];
  string local_c0;
  string *local_a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_98;
  string local_80;
  undefined8 local_60;
  char *local_58;
  size_type local_50;
  pointer local_48;
  undefined8 local_40;
  char *local_38;
  
  local_108 = te;
  cmTarget::GetAllInterfaceFileSets_abi_cxx11_(&local_98,gte->Target);
  if (local_98.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_98.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pcVar1 = (this->Namespace)._M_dataplus._M_p;
    pcVar2 = (char *)(this->Namespace)._M_string_length;
    cmGeneratorTarget::GetExportName_abi_cxx11_(&local_128,gte);
    local_80.field_2._M_allocated_capacity = local_128._M_string_length;
    local_80.field_2._8_8_ = local_128._M_dataplus._M_p;
    views._M_len = 2;
    views._M_array = (iterator)&local_80;
    local_80._M_dataplus._M_p = pcVar2;
    local_80._M_string_length = (size_type)pcVar1;
    cmCatViews_abi_cxx11_(&local_c0,views);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (os,"if(NOT CMAKE_VERSION VERSION_LESS \"3.23.0\")\n  target_sources(",0x3d);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (os,local_c0._M_dataplus._M_p,local_c0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    local_a0 = local_98.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    name = local_98.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
    if (local_98.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_98.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      do {
        wrapQuotes = (WrapQuotes)in_R8;
        pcVar5 = cmTarget::GetFileSet(gte->Target,name);
        if (pcVar5 == (cmFileSet *)0x0) {
          this_00 = gte->Makefile;
          pcVar1 = (name->_M_dataplus)._M_p;
          sVar3 = name->_M_string_length;
          psVar6 = cmGeneratorTarget::GetName_abi_cxx11_(gte);
          local_80._M_dataplus._M_p = (char *)0xa;
          local_80._M_string_length = 0x762ed4;
          local_60 = 0x26;
          local_58 = "\" is listed in interface file sets of ";
          local_48 = (psVar6->_M_dataplus)._M_p;
          local_50 = psVar6->_M_string_length;
          local_40 = 0x19;
          local_38 = " but has not been created";
          views_00._M_len = 5;
          views_00._M_array = (iterator)&local_80;
          local_80.field_2._M_allocated_capacity = sVar3;
          local_80.field_2._8_8_ = pcVar1;
          cmCatViews_abi_cxx11_(&local_128,views_00);
          cmMakefile::IssueMessage(this_00,FATAL_ERROR,&local_128);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_128._M_dataplus._M_p != &local_128.field_2) {
            operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
          }
          goto LAB_00455881;
        }
        std::__ostream_insert<char,std::char_traits<char>>(os,"    INTERFACE",0xd);
        std::__ostream_insert<char,std::char_traits<char>>(os,"\n      FILE_SET ",0x10);
        str._M_str = (char *)0x0;
        str._M_len = (size_t)(name->_M_dataplus)._M_p;
        cmOutputConverter::EscapeForCMake_abi_cxx11_
                  (&local_80,(cmOutputConverter *)name->_M_string_length,str,wrapQuotes);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (os,local_80._M_dataplus._M_p,local_80._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n      TYPE ",0xc);
        str_00._M_str = (char *)0x0;
        str_00._M_len = (size_t)(pcVar5->Type)._M_dataplus._M_p;
        cmOutputConverter::EscapeForCMake_abi_cxx11_
                  (&local_128,(cmOutputConverter *)(pcVar5->Type)._M_string_length,str_00,wrapQuotes
                  );
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar4,local_128._M_dataplus._M_p,local_128._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n      BASE_DIRS ",0x11);
        (*this->_vptr_cmExportFileGenerator[0x11])(&local_e0,this,gte,pcVar5,local_108);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar4,(char *)local_e0,local_d8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n      FILES ",0xd);
        in_R8 = local_108;
        (*this->_vptr_cmExportFileGenerator[0x12])(&local_100,this,gte);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar4,(char *)local_100,local_f8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
        if (local_100 != local_f0) {
          operator_delete(local_100,local_f0[0] + 1);
        }
        if (local_e0 != local_d0) {
          operator_delete(local_e0,local_d0[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_128._M_dataplus._M_p != &local_128.field_2) {
          operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
        }
        name = name + 1;
      } while (name != local_a0);
    }
    std::__ostream_insert<char,std::char_traits<char>>(os,"  )\nendif()\n\n",0xd);
LAB_00455881:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_98);
  return;
}

Assistant:

void cmExportFileGenerator::GenerateTargetFileSets(cmGeneratorTarget* gte,
                                                   std::ostream& os,
                                                   cmTargetExport* te)
{
  auto interfaceFileSets = gte->Target->GetAllInterfaceFileSets();
  if (!interfaceFileSets.empty()) {
    std::string targetName = cmStrCat(this->Namespace, gte->GetExportName());
    os << "if(NOT CMAKE_VERSION VERSION_LESS \"3.23.0\")\n"
          "  target_sources("
       << targetName << "\n";

    for (auto const& name : interfaceFileSets) {
      auto* fileSet = gte->Target->GetFileSet(name);
      if (!fileSet) {
        gte->Makefile->IssueMessage(
          MessageType::FATAL_ERROR,
          cmStrCat("File set \"", name,
                   "\" is listed in interface file sets of ", gte->GetName(),
                   " but has not been created"));
        return;
      }

      os << "    INTERFACE"
         << "\n      FILE_SET " << cmOutputConverter::EscapeForCMake(name)
         << "\n      TYPE "
         << cmOutputConverter::EscapeForCMake(fileSet->GetType())
         << "\n      BASE_DIRS "
         << this->GetFileSetDirectories(gte, fileSet, te) << "\n      FILES "
         << this->GetFileSetFiles(gte, fileSet, te) << "\n";
    }

    os << "  )\nendif()\n\n";
  }
}